

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromString(DoubleAPFloat *this,StringRef S,roundingMode RM)

{
  opStatus oVar1;
  APFloat Tmp;
  DoubleAPFloat local_70;
  APInt local_60;
  APFloat local_50;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    IEEEFloat::IEEEFloat(&local_50.U.IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy);
    oVar1 = APFloat::convertFromString(&local_50,S,RM);
    APFloat::bitcastToAPInt((APFloat *)&local_60);
    DoubleAPFloat(&local_70,(fltSemantics *)semPPCDoubleDouble,&local_60);
    operator=(this,&local_70);
    std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
              (&local_70.Floats);
    APInt::~APInt(&local_60);
    APFloat::Storage::~Storage((Storage *)&local_50.U.IEEE);
    return oVar1;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10bc,
                "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromString(StringRef, roundingMode)"
               );
}

Assistant:

APFloat::opStatus DoubleAPFloat::convertFromString(StringRef S,
                                                   roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromString(S, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}